

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O2

void test_convert<double,float>(uint length,double value)

{
  float fVar1;
  double *pdVar2;
  float *__p;
  undefined8 *puVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  double *local_38;
  shared_ptr<double> pt;
  shared_ptr<float> pu;
  
  pdVar2 = sse::common::malloc<double>(length);
  std::__shared_ptr<double,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<double,void(*)(double*),void>
            ((__shared_ptr<double,(__gnu_cxx::_Lock_policy)2> *)&local_38,pdVar2,
             sse::common::free<double>);
  __p = sse::common::malloc<float>(length);
  std::__shared_ptr<float,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<float,void(*)(float*),void>
            ((__shared_ptr<float,(__gnu_cxx::_Lock_policy)2> *)
             &pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p,
             sse::common::free<float>);
  pdVar2 = local_38;
  for (uVar4 = length; 7 < (int)uVar4; uVar4 = uVar4 - 8) {
    *pdVar2 = value;
    pdVar2[1] = value;
    pdVar2[2] = value;
    pdVar2[3] = value;
    pdVar2[4] = value;
    pdVar2[5] = value;
    pdVar2[6] = value;
    pdVar2[7] = value;
    pdVar2 = pdVar2 + 8;
  }
  if (3 < (int)uVar4) {
    *pdVar2 = value;
    pdVar2[1] = value;
    pdVar2[2] = value;
    pdVar2[3] = value;
    uVar4 = uVar4 - 4;
    pdVar2 = pdVar2 + 4;
  }
  if (1 < (int)uVar4) {
    *pdVar2 = value;
    pdVar2[1] = value;
    uVar4 = uVar4 - 2;
    pdVar2 = pdVar2 + 2;
  }
  if (uVar4 != 0) {
    *pdVar2 = value;
  }
  nosimd::common::convert<double,float>
            (local_38,(float *)pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi,length);
  uVar5 = 0;
  do {
    if (length == uVar5) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt);
      return;
    }
    fVar1 = *(float *)((long)&(pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + uVar5 * 4);
    fVar6 = fVar1 - (float)value;
    uVar4 = -(uint)(fVar6 < 0.0);
    uVar5 = uVar5 + 1;
  } while ((float)(~uVar4 & (uint)fVar6 | (uint)((float)value - fVar1) & uVar4) < 1.1920929e-07);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar3 = "void test_convert(unsigned int, _T) [_T = double, _U = float]";
  *(undefined4 *)(puVar3 + 1) = 0x17;
  *(uint *)((long)puVar3 + 0xc) = length;
  __cxa_throw(puVar3,&Exception::typeinfo,0);
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}